

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::GeneratedCodeInfo::ByteSizeLong(GeneratedCodeInfo *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  GeneratedCodeInfo *in_RDI;
  int cached_size;
  GeneratedCodeInfo_Annotation *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *__range2;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  reference in_stack_ffffffffffffffb0;
  iterator local_48;
  RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation> local_40;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *local_38;
  undefined4 local_2c;
  size_t local_28;
  size_t local_18;
  InternalMetadataWithArena *local_10;
  InternalMetadataWithArena *local_8;
  
  local_28 = 0;
  local_2c = 0;
  iVar2 = _internal_annotation_size((GeneratedCodeInfo *)0x51a519);
  local_28 = (long)iVar2 + local_28;
  local_38 = &in_RDI->annotation_;
  local_40.it_ = (void **)RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::begin
                                    ((RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>
                                      *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ));
  local_48.it_ = (void **)RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::end
                                    ((RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>
                                      *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ));
  while( true ) {
    bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::
            operator!=(&local_40,&local_48);
    if (!bVar1) break;
    in_stack_ffffffffffffffb0 =
         internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::
         operator*(&local_40);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::GeneratedCodeInfo_Annotation>
                      ((GeneratedCodeInfo_Annotation *)0x51a586);
    local_28 = sVar3 + local_28;
    internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::operator++
              (&local_40);
  }
  local_10 = &in_RDI->_internal_metadata_;
  local_8 = local_10;
  if (((uint)(local_10->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_18 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)in_stack_ffffffffffffffb0,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (CachedSize *)in_RDI);
  }
  else {
    internal::ToCachedSize(local_28);
    SetCachedSize(in_RDI,in_stack_ffffffffffffff9c);
    local_18 = local_28;
  }
  return local_18;
}

Assistant:

size_t GeneratedCodeInfo::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.GeneratedCodeInfo)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
  total_size += 1UL * this->_internal_annotation_size();
  for (const auto& msg : this->annotation_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}